

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  string_view end_varname_00;
  Printer *pPVar3;
  Options *pOVar4;
  undefined1 uVar5;
  Semantic local_454;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_450;
  string_view local_448;
  string_view local_438;
  string_view local_428;
  FieldDescriptor local_418;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  string_view local_3a8;
  string_view local_398;
  FieldDescriptor local_388;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_330;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  string_view local_318;
  string_view local_308;
  FieldDescriptor local_2f8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_2a0;
  FieldDescriptor local_298;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_240;
  FieldDescriptor local_238;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  FieldDescriptor local_1d8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_180;
  FieldDescriptor local_178;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_120;
  Options local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  string_view local_b8;
  string_view local_a8;
  string_view local_98 [2];
  Options local_78;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableMessageFieldGenerator).variables_,local_28);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options(&local_78,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_78,false,false,false);
  java::Options::~Options(&local_78);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_98[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_a8,local_b8,pFVar1,local_c0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options(&local_118,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_118,false,false,false);
  java::Options::~Options(&local_118);
  pPVar2 = local_18;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_120);
  uVar5 = 0x9b;
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x16])
            (this,pPVar2,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$()",
             "if ($has_oneof_case_message$) {\n  return ($type$) $oneof_name$_;\n}\nreturn $type$.getDefaultInstance();\n"
             ,
             "if ($has_oneof_case_message$) {\n  return $name$Builder_.getMessage();\n}\nreturn $type$.getDefaultInstance();\n"
             ,0,local_120);
  pPVar3 = local_18;
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_178,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_178,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_178);
  pPVar2 = local_18;
  local_1d8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_180,
             (Semantic *)((long)&local_1d8.field_20 + 4));
  uVar5 = 0x8e;
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$oneof_name$_ = value;\n$on_changed$\n"
             ,"$name$Builder_.setMessage(value);\n","$set_oneof_case_message$;\nreturn this;\n",
             local_180);
  pPVar3 = local_18;
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_1d8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_1d8,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_1d8);
  pPVar2 = local_18;
  local_238.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_1e0,
             (Semantic *)((long)&local_238.field_20 + 4));
  uVar5 = 0x69;
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x16])
            (this,pPVar2,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    $type$.Builder builderForValue)"
             ,"$oneof_name$_ = builderForValue.build();\n$on_changed$\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_oneof_case_message$;\nreturn this;\n",local_1e0);
  pPVar3 = local_18;
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_238,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_238,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_238);
  pPVar2 = local_18;
  local_298.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_240,
             (Semantic *)((long)&local_298.field_20 + 4));
  uVar5 = 0xb1;
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
             "if ($has_oneof_case_message$ &&\n    $oneof_name$_ != $type$.getDefaultInstance()) {\n  $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n      .mergeFrom(value).buildPartial();\n} else {\n  $oneof_name$_ = value;\n}\n$on_changed$\n"
             ,
             "if ($has_oneof_case_message$) {\n  $name$Builder_.mergeFrom(value);\n} else {\n  $name$Builder_.setMessage(value);\n}\n"
             ,"$set_oneof_case_message$;\nreturn this;\n",local_240);
  pPVar3 = local_18;
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_298,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_298,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_298);
  pPVar2 = local_18;
  local_2f8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_2a0,
             (Semantic *)((long)&local_2f8.field_20 + 4));
  uVar5 = 200;
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public Builder ${$clear$capitalized_name$$}$()",
             "if ($has_oneof_case_message$) {\n  $clear_oneof_case_message$;\n  $oneof_name$_ = null;\n  $on_changed$\n}\n"
             ,
             "if ($has_oneof_case_message$) {\n  $clear_oneof_case_message$;\n  $oneof_name$_ = null;\n}\n$name$Builder_.clear();\n"
             ,"return this;\n",local_2a0);
  pPVar3 = local_18;
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_2f8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_2f8,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_2f8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_308,
             "$deprecation$public $type$.Builder ${$get$capitalized_name$Builder$}$() {\n  return internalGet$capitalized_name$FieldBuilder().getBuilder();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_308);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_318,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  local_388.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_330,(Semantic *)((long)&local_388.field_20 + 4));
  end_varname_00._M_str = local_328._M_str;
  end_varname_00._M_len = local_328._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_318,end_varname_00,pFVar1,local_330);
  pPVar3 = local_18;
  uVar5 = SUB81(local_328._M_str,0);
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_388,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_388,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_388);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_398,
             "@java.lang.Override\n$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if (($has_oneof_case_message$) && ($name$Builder_ != null)) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    if ($has_oneof_case_message$) {\n      return ($type$) $oneof_name$_;\n    }\n    return $type$.getDefaultInstance();\n  }\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_398);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_3c0);
  end_varname._M_str = local_3b8._M_str;
  end_varname._M_len = local_3b8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_3a8,end_varname,pFVar1,local_3c0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_3b8._M_str,0);
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_418,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_418,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_418);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,
             "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> \n    ${$internalGet$capitalized_name$FieldBuilder$}$() {\n  if ($name$Builder_ == null) {\n    if (!($has_oneof_case_message$)) {\n      $oneof_name$_ = $type$.getDefaultInstance();\n    }\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            ($type$) $oneof_name$_,\n            getParentForChildren(),\n            isClean());\n    $oneof_name$_ = null;\n  }\n  $set_oneof_case_message$;\n  $on_changed$\n  return $name$Builder_;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_428);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_438,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_448,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  local_454 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_450,&local_454);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_438,local_448,pFVar1,local_450);
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.
  printer->Print(variables_,
                 // If this builder is non-null, it is used and the other fields
                 // are ignored.
                 "private com.google.protobuf.SingleFieldBuilder<\n"
                 "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
                 "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField()
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  PrintNestedBuilderFunction(
      printer,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$()",

      "if ($has_oneof_case_message$) {\n"
      "  return ($type$) $oneof_name$_;\n"
      "}\n"
      "return $type$.getDefaultInstance();\n",

      "if ($has_oneof_case_message$) {\n"
      "  return $name$Builder_.getMessage();\n"
      "}\n"
      "return $type$.getDefaultInstance();\n",

      nullptr);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",

      "if (value == null) {\n"
      "  throw new NullPointerException();\n"
      "}\n"
      "$oneof_name$_ = value;\n"
      "$on_changed$\n",

      "$name$Builder_.setMessage(value);\n",

      "$set_oneof_case_message$;\n"
      "return this;\n",
      Semantic::kSet);

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
      "    $type$.Builder builderForValue)",

      "$oneof_name$_ = builderForValue.build();\n"
      "$on_changed$\n",

      "$name$Builder_.setMessage(builderForValue.build());\n",

      "$set_oneof_case_message$;\n"
      "return this;\n",
      Semantic::kSet);

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",

      "if ($has_oneof_case_message$ &&\n"
      "    $oneof_name$_ != $type$.getDefaultInstance()) {\n"
      "  $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n"
      "      .mergeFrom(value).buildPartial();\n"
      "} else {\n"
      "  $oneof_name$_ = value;\n"
      "}\n"
      "$on_changed$\n",

      "if ($has_oneof_case_message$) {\n"
      "  $name$Builder_.mergeFrom(value);\n"
      "} else {\n"
      "  $name$Builder_.setMessage(value);\n"
      "}\n",

      "$set_oneof_case_message$;\n"
      "return this;\n",
      Semantic::kSet);

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer, "$deprecation$public Builder ${$clear$capitalized_name$$}$()",

      "if ($has_oneof_case_message$) {\n"
      "  $clear_oneof_case_message$;\n"
      "  $oneof_name$_ = null;\n"
      "  $on_changed$\n"
      "}\n",

      "if ($has_oneof_case_message$) {\n"
      "  $clear_oneof_case_message$;\n"
      "  $oneof_name$_ = null;\n"
      "}\n"
      "$name$Builder_.clear();\n",

      "return this;\n", Semantic::kSet);

  // $type$.Builder getFieldBuilder
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$.Builder "
                 "${$get$capitalized_name$Builder$}$() {\n"
                 "  return "
                 "internalGet$capitalized_name$FieldBuilder().getBuilder();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$OrBuilder "
      "${$get$capitalized_name$OrBuilder$}$() {\n"
      "  if (($has_oneof_case_message$) && ($name$Builder_ != null)) {\n"
      "    return $name$Builder_.getMessageOrBuilder();\n"
      "  } else {\n"
      "    if ($has_oneof_case_message$) {\n"
      "      return ($type$) $oneof_name$_;\n"
      "    }\n"
      "    return $type$.getDefaultInstance();\n"
      "  }\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  // SingleFieldBuilder internalGetFieldFieldBuilder
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "private com.google.protobuf.SingleFieldBuilder<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> \n"
      "    ${$internalGet$capitalized_name$FieldBuilder$}$() {\n"
      "  if ($name$Builder_ == null) {\n"
      "    if (!($has_oneof_case_message$)) {\n"
      "      $oneof_name$_ = $type$.getDefaultInstance();\n"
      "    }\n"
      "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n"
      "        $type$, $type$.Builder, $type$OrBuilder>(\n"
      "            ($type$) $oneof_name$_,\n"
      "            getParentForChildren(),\n"
      "            isClean());\n"
      "    $oneof_name$_ = null;\n"
      "  }\n"
      "  $set_oneof_case_message$;\n"
      "  $on_changed$\n"
      "  return $name$Builder_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}